

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::TapAssertionPrinter::printRemainingMessages
          (TapAssertionPrinter *this,Code colour)

{
  uint64_t count;
  bool bVar1;
  ostream *poVar2;
  pointer pMVar3;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  *__lhs;
  ColourGuard local_88;
  StringRef local_78;
  pluralise local_68;
  ColourGuard local_40;
  uint64_t local_30;
  size_t N;
  const_iterator itEnd;
  Code colour_local;
  TapAssertionPrinter *this_local;
  
  itEnd = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end(this->messages);
  bVar1 = __gnu_cxx::operator==(&this->itMessage,&itEnd);
  if (!bVar1) {
    N = (size_t)std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                          (this->messages);
    local_30 = __gnu_cxx::operator-
                         ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                           *)&N,&this->itMessage);
    poVar2 = this->stream;
    ColourImpl::guardColour((ColourImpl *)&local_40,(Code)this->colourImpl);
    poVar2 = Catch::operator<<(poVar2,&local_40);
    poVar2 = std::operator<<(poVar2," with ");
    count = local_30;
    local_78 = operator____sr("message",7);
    pluralise::pluralise(&local_68,count,local_78);
    poVar2 = Catch::operator<<(poVar2,&local_68);
    std::operator<<(poVar2,':');
    ColourImpl::ColourGuard::~ColourGuard(&local_40);
    while (bVar1 = __gnu_cxx::operator!=
                             (&this->itMessage,
                              (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)&N), bVar1) {
      if (((this->printInfoMessages & 1U) != 0) ||
         (pMVar3 = __gnu_cxx::
                   __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                   ::operator->(&this->itMessage), pMVar3->type != Info)) {
        poVar2 = std::operator<<(this->stream," \'");
        pMVar3 = __gnu_cxx::
                 __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                 ::operator->(&this->itMessage);
        poVar2 = std::operator<<(poVar2,(string *)&pMVar3->message);
        std::operator<<(poVar2,'\'');
        __lhs = __gnu_cxx::
                __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                ::operator++(&this->itMessage);
        bVar1 = __gnu_cxx::operator!=
                          (__lhs,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                  *)&N);
        if (bVar1) {
          poVar2 = this->stream;
          ColourImpl::guardColour((ColourImpl *)&local_88,(Code)this->colourImpl);
          poVar2 = Catch::operator<<(poVar2,&local_88);
          std::operator<<(poVar2," and");
          ColourImpl::ColourGuard::~ColourGuard(&local_88);
        }
      }
    }
  }
  return;
}

Assistant:

void printRemainingMessages(Colour::Code colour = tapDimColour) {
                if (itMessage == messages.end()) {
                    return;
                }

                // using messages.end() directly (or auto) yields compilation error:
                std::vector<MessageInfo>::const_iterator itEnd = messages.end();
                const std::size_t N = static_cast<std::size_t>(itEnd - itMessage);

                stream << colourImpl->guardColour( colour ) << " with "
                       << pluralise( N, "message"_sr ) << ':';

                for (; itMessage != itEnd; ) {
                    // If this assertion is a warning ignore any INFO messages
                    if (printInfoMessages || itMessage->type != ResultWas::Info) {
                        stream << " '" << itMessage->message << '\'';
                        if (++itMessage != itEnd) {
                            stream << colourImpl->guardColour(tapDimColour) << " and";
                        }
                    }
                }
            }